

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O2

int ARKodeResFtolerance(void *arkode_mem,ARKRwtFn rfun)

{
  int iVar1;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x24d;
  }
  else if (*(int *)((long)arkode_mem + 0x200) == 0) {
    msgfmt = "time-stepping module does not support non-identity mass matrices";
    error_code = -0x30;
    iVar1 = 0x256;
  }
  else {
    if (*(int *)((long)arkode_mem + 0x3c0) != 0) {
      if (*(int *)((long)arkode_mem + 0x240) != 0) {
        *(undefined8 *)((long)arkode_mem + 0x238) = 0;
        iVar1 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x230),
                            (N_Vector *)((long)arkode_mem + 0x238));
        if (iVar1 == 0) {
          arkProcessError((ARKodeMem)arkode_mem,-0x14,0x268,"ARKodeResFtolerance",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                          ,"Allocation of arkode_mem failed.");
          return -0x16;
        }
        *(undefined4 *)((long)arkode_mem + 0x240) = 0;
      }
      *(undefined4 *)((long)arkode_mem + 0x1c) = 2;
      *(undefined4 *)((long)arkode_mem + 0x68) = 1;
      *(ARKRwtFn *)((long)arkode_mem + 0x70) = rfun;
      *(undefined8 *)((long)arkode_mem + 0x78) = *(undefined8 *)((long)arkode_mem + 0x10);
      return 0;
    }
    msgfmt = "Attempt to call before ARKodeInit.";
    error_code = -0x17;
    iVar1 = 0x25d;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeResFtolerance",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int ARKodeResFtolerance(void* arkode_mem, ARKRwtFn rfun)
{
  /* unpack ark_mem */
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not support mass matrices */
  if (!ark_mem->step_supports_massmatrix)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support non-identity mass matrices");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  if (ark_mem->MallocDone == SUNFALSE)
  {
    arkProcessError(ark_mem, ARK_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MALLOC);
    return (ARK_NO_MALLOC);
  }

  /* Allocate space for rwt if necessary */
  if (ark_mem->rwt_is_ewt)
  {
    ark_mem->rwt = NULL;
    if (!arkAllocVec(ark_mem, ark_mem->ewt, &(ark_mem->rwt)))
    {
      arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                      MSG_ARK_ARKMEM_FAIL);
      return (ARK_ILL_INPUT);
    }
    ark_mem->rwt_is_ewt = SUNFALSE;
  }

  /* Copy tolerance data into memory */
  ark_mem->ritol     = ARK_WF;
  ark_mem->user_rfun = SUNTRUE;
  ark_mem->rfun      = rfun;
  ark_mem->r_data    = ark_mem->user_data;

  return (ARK_SUCCESS);
}